

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  bool bVar1;
  uint defaultPort;
  WaitScope *__stat_loc;
  char *__n;
  size_t sVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int __flags;
  StringPtr name;
  StringPtr bindAddress;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr serverAddress;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  ReaderOptions readerOpts;
  ReaderOptions readerOpts_00;
  Own<capnp::ClientHook> local_250;
  int local_23c;
  EzRpcServer server;
  int callCount;
  undefined1 local_220 [24];
  EzRpcClient client;
  uint local_1f4;
  undefined1 local_1f0 [64];
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_1b0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_178;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Own<capnp::ClientHook> local_100;
  Own<capnp::ClientHook> local_f0;
  Client cap;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Maybe<capnp::MessageSize> local_90;
  Maybe<capnp::MessageSize> local_78;
  Maybe<capnp::MessageSize> local_60;
  Maybe<capnp::MessageSize> local_48;
  Maybe<capnp::MessageSize> local_30;
  
  bindAddress.content.size_ = 10;
  bindAddress.content.ptr = "localhost";
  readerOpts._8_8_ = 0x40;
  readerOpts.traversalLimitInWords = 0x800000;
  EzRpcServer::EzRpcServer(&server,bindAddress,0,readerOpts);
  callCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&response,&callCount);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&local_f0,(Own<capnp::_::TestInterfaceImpl> *)&response);
  name_00.content.size_ = 5;
  name_00.content.ptr = "cap1";
  EzRpcServer::exportCap(&server,name_00,(Client *)&local_f0);
  kj::Own<capnp::ClientHook>::dispose(&local_f0);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&response);
  kj::heap<capnp::_::TestCallOrderImpl>();
  Capability::Client::Client<capnp::_::TestCallOrderImpl,void>
            ((Client *)&local_100,(Own<capnp::_::TestCallOrderImpl> *)&response);
  name_01.content.size_ = 5;
  name_01.content.ptr = "cap2";
  EzRpcServer::exportCap(&server,name_01,(Client *)&local_100);
  kj::Own<capnp::ClientHook>::dispose(&local_100);
  kj::Own<capnp::_::TestCallOrderImpl>::dispose((Own<capnp::_::TestCallOrderImpl> *)&response);
  EzRpcServer::getPort((EzRpcServer *)&response);
  __stat_loc = EzRpcServer::getWaitScope(&server);
  defaultPort = kj::Promise<unsigned_int>::wait((Promise<unsigned_int> *)&response,__stat_loc);
  serverAddress.content.size_ = 10;
  serverAddress.content.ptr = "localhost";
  readerOpts_00._8_8_ = 0x40;
  readerOpts_00.traversalLimitInWords = 0x800000;
  __flags = 0x800000;
  EzRpcClient::EzRpcClient(&client,serverAddress,defaultPort,readerOpts_00);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&response);
  __n = (char *)0x5;
  name.content.size_ = 5;
  name.content.ptr = "cap1";
  EzRpcClient::importCap<capnproto_test::capnp::test::TestInterface>(&cap,&client,name);
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&request,&cap,&local_30);
  *(undefined4 *)request.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request.super_Builder._builder.data + 4) =
       *(byte *)((long)request.super_Builder._builder.data + 4) | 1;
  __buf = extraout_RDX;
  if ((callCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response.super_Reader._reader.segment._0_4_ = 0;
    __n = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
    __flags = 0x4c8271;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response,&callCount);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_1f0,(int)&request,__buf,(size_t)__n,__flags);
  EzRpcServer::getWaitScope(&server);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,local_1f0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_1f0);
  local_1f0._0_16_ =
       (undefined1  [16])
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response.super_Reader);
  bVar1 = kj::operator==("foo",(StringPtr *)local_1f0);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_1f0._0_16_ =
         (undefined1  [16])
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response.super_Reader);
    __flags = 0x4c9a59;
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x40,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4f93d8,(Reader *)local_1f0);
  }
  if ((callCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0._0_4_ = 1;
    __flags = 0x4cb0a8;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_1f0,&callCount);
  }
  sVar2 = 5;
  name_02.content.size_ = (size_t)"cap2";
  name_02.content.ptr = (char *)&client;
  EzRpcClient::importCap((EzRpcClient *)&local_250,name_02);
  Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>
            ((Client *)local_220,(Client *)&local_250);
  local_48.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_1b0,(Client *)local_220,&local_48);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_178,(int)&local_1b0,__buf_00,sVar2,__flags);
  EzRpcServer::getWaitScope(&server);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_1f0,&local_178);
  if ((uint)local_1f0._32_4_ < 0x20) {
    bVar1 = false;
  }
  else {
    bVar1 = *(int *)(_func_int ***)local_1f0._16_8_ != 0;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_1f0 + 0x30));
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_178);
  kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_220 + 8));
  kj::Own<capnp::ClientHook>::dispose(&local_250);
  if ((bool)(bVar1 & kj::_::Debug::minSeverity < 3)) {
    local_23c = 0;
    sVar2 = 5;
    name_03.content.size_ = (size_t)"cap2";
    name_03.content.ptr = (char *)&client;
    EzRpcClient::importCap((EzRpcClient *)&local_250,name_03);
    Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>
              ((Client *)local_220,(Client *)&local_250);
    local_60.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_1b0,(Client *)local_220,&local_60);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send(&local_178,(int)&local_1b0,__buf_01,sVar2,__flags);
    EzRpcServer::getWaitScope(&server);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_1f0,&local_178);
    local_1f4 = 0;
    if (0x1f < (uint)local_1f0._32_4_) {
      local_1f4 = *(uint *)(_func_int ***)local_1f0._16_8_;
    }
    __flags = 0x4fe50c;
    kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x44,ERROR,
               "\"failed: expected \" \"(0) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 0, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
               ,(char (*) [149])
                "failed: expected (0) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
               ,&local_23c,&local_1f4);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_1f0 + 0x30));
    RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
    ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                    *)&local_178);
    kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_220 + 8));
    kj::Own<capnp::ClientHook>::dispose(&local_250);
  }
  sVar2 = 5;
  name_04.content.size_ = (size_t)"cap2";
  name_04.content.ptr = (char *)&client;
  EzRpcClient::importCap((EzRpcClient *)&local_250,name_04);
  Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>
            ((Client *)local_220,(Client *)&local_250);
  local_78.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_1b0,(Client *)local_220,&local_78);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_178,(int)&local_1b0,__buf_02,sVar2,__flags);
  EzRpcServer::getWaitScope(&server);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_1f0,&local_178);
  bVar1 = true;
  if (0x1f < (uint)local_1f0._32_4_) {
    bVar1 = *(int *)(_func_int ***)local_1f0._16_8_ != 1;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_1f0 + 0x30));
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_178);
  kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_220 + 8));
  kj::Own<capnp::ClientHook>::dispose(&local_250);
  if ((bool)(bVar1 & kj::_::Debug::minSeverity < 3)) {
    local_23c = 1;
    sVar2 = 5;
    name_05.content.size_ = (size_t)"cap2";
    name_05.content.ptr = (char *)&client;
    EzRpcClient::importCap((EzRpcClient *)&local_250,name_05);
    Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>
              ((Client *)local_220,(Client *)&local_250);
    local_90.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_1b0,(Client *)local_220,&local_90);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send(&local_178,(int)&local_1b0,__buf_03,sVar2,__flags);
    EzRpcServer::getWaitScope(&server);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_1f0,&local_178);
    local_1f4 = 0;
    if (0x1f < (uint)local_1f0._32_4_) {
      local_1f4 = *(uint *)(_func_int ***)local_1f0._16_8_;
    }
    kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(1) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 1, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
               ,(char (*) [149])
                "failed: expected (1) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
               ,&local_23c,&local_1f4);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_1f0 + 0x30));
    RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
    ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                    *)&local_178);
    kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_220 + 8));
    kj::Own<capnp::ClientHook>::dispose(&local_250);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  EzRpcClient::~EzRpcClient(&client);
  EzRpcServer::~EzRpcServer(&server);
  return;
}

Assistant:

TEST(EzRpc, DeprecatedNames) {
  EzRpcServer server("localhost");
  int callCount = 0;
  server.exportCap("cap1", kj::heap<TestInterfaceImpl>(callCount));
  server.exportCap("cap2", kj::heap<TestCallOrderImpl>());

  EzRpcClient client("localhost", server.getPort().wait(server.getWaitScope()));

  auto cap = client.importCap<test::TestInterface>("cap1");
  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(server.getWaitScope());
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);

  EXPECT_EQ(0, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
  EXPECT_EQ(1, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
}